

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirD24(void)

{
  int iVar1;
  long lVar2;
  bool local_629;
  uint local_628 [2];
  int e [390];
  int teller;
  aint val;
  
  e[0x184] = 0;
  do {
    iVar1 = SkipBlanks();
    if (iVar1 == 0) {
      iVar1 = ParseExpressionNoSyntaxError(&lp,e + 0x185);
      if (iVar1 == 0) {
        Error("[D24] Syntax error",lp,SUPPRESS);
        break;
      }
      check24(e[0x185]);
      lVar2 = (long)e[0x184];
      e[0x184] = e[0x184] + 1;
      e[lVar2 + -2] = e[0x185] & 0xff;
      lVar2 = (long)e[0x184];
      e[0x184] = e[0x184] + 1;
      e[lVar2 + -2] = e[0x185] >> 8 & 0xff;
      lVar2 = (long)e[0x184];
      e[0x184] = e[0x184] + 1;
      e[lVar2 + -2] = e[0x185] >> 0x10 & 0xff;
    }
    else {
      Error("Expression expected",(char *)0x0,SUPPRESS);
    }
    local_629 = comma(&lp);
    local_629 = local_629 && e[0x184] < 0x180;
  } while (local_629);
  e[(long)e[0x184] + -2] = -1;
  if ((e[0x184] == 0x180) && (*lp != '\0')) {
    Error("Over 128 values in D24. Values over",lp,SUPPRESS);
  }
  if (e[0x184] == 0) {
    Error("D24 with no arguments",(char *)0x0,PASS3);
  }
  else {
    EmitBytes((int *)local_628,false);
  }
  return;
}

Assistant:

static void dirD24() {
	aint val;
	int teller = 0, e[130 * 3];
	do {
		if (SkipBlanks()) {
			Error("Expression expected", NULL, SUPPRESS);
		} else if (ParseExpressionNoSyntaxError(lp, val)) {
			check24(val);
			e[teller++] = val & 255; e[teller++] = (val >> 8) & 255; e[teller++] = (val >> 16) & 255;
		} else {
			Error("[D24] Syntax error", lp, SUPPRESS);
			break;
		}
	} while (comma(lp) && teller < 128*3);
	e[teller] = -1;
	if (teller == 128*3 && *lp) Error("Over 128 values in D24. Values over", lp, SUPPRESS);
	if (teller) EmitBytes(e);
	else		Error("D24 with no arguments");
}